

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void duckdb_fmt::v6::internal::
     handle_int_type_spec<duckdb_fmt::v6::basic_format_specs<wchar_t>,duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>>
               (basic_format_specs<wchar_t> *specs,
               int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *handler)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (specs->thousands == '\0') {
    cVar1 = specs->type;
    if (cVar1 == '\0') {
LAB_01ea6cfb:
      basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(handler);
      return;
    }
    if (cVar1 == 'B') {
LAB_01ea6d19:
      basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(handler);
      return;
    }
    if (cVar1 != 'L') {
      if (cVar1 != 'X') {
        if (cVar1 == 'b') goto LAB_01ea6d19;
        if (cVar1 != 'x') {
          if ((cVar1 != 'l') && (cVar1 != 'n')) {
            if (cVar1 == 'o') {
              basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
              int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_oct(handler);
              return;
            }
            if (cVar1 != 'd') {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
              std::operator+(&local_50,"Invalid type specifier \"",&local_70);
              std::operator+(&local_30,&local_50,"\" for formatting a value of type int");
              basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
              int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_error
                        (handler,&local_30);
            }
            goto LAB_01ea6cfb;
          }
          goto LAB_01ea6cb7;
        }
      }
      basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
      int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(handler);
      return;
    }
  }
LAB_01ea6cb7:
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
  int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(const Spec& specs, Handler&& handler) {
  if (specs.thousands != '\0') {
    handler.on_num();
    return;
  }
  switch (specs.type) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'l':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type int");
  }
}